

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

int CfdFreeBuffer(void *address)

{
  cfd::Initialize();
  if (address != (void *)0x0) {
    free(address);
  }
  return 0;
}

Assistant:

int CfdFreeBuffer(void* address) {
  try {
    cfd::Initialize();
    if (address != nullptr) ::free(address);
    return kCfdSuccess;
  } catch (...) {
    return kCfdUnknownError;
  }
}